

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void ravi_create_number_array(lua_State *L,int narray,lua_Number initial_value)

{
  int iVar1;
  StkId pTVar2;
  int *piVar3;
  RaviArray *pRVar4;
  char *__assertion;
  
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x340,"void ravi_create_number_array(lua_State *, int, lua_Number)");
  }
  pRVar4 = raviH_new_number_array(L,narray,initial_value);
  if ((pRVar4->tt & 0xe) < 10) {
    pTVar2 = L->top;
    (pTVar2->value_).gc = (GCObject *)pRVar4;
    pTVar2->tt_ = 0x8025;
    if ((pRVar4->tt == '%') && ((pRVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      if (L->ci->top < pTVar2 + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x343,"void ravi_create_number_array(lua_State *, int, lua_Number)");
      }
      if (0 < L->l_G->GCdebt) {
        luaC_step(L);
      }
      piVar3 = *(int **)&L[-1].hookmask;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        return;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x345,"void ravi_create_number_array(lua_State *, int, lua_Number)");
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x342,"void ravi_create_number_array(lua_State *, int, lua_Number)");
}

Assistant:

LUA_API void ravi_create_number_array(lua_State *L, int narray,
                                    lua_Number initial_value) {
  RaviArray *t;
  lua_lock(L);
  t = raviH_new_number_array(L, (unsigned int)narray, initial_value);
  setfarrayvalue(L, L->top, t);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
}